

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall
testing::internal::ExpectationBase::UntypedTimes(ExpectationBase *this,Cardinality *a_cardinality)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  FailureReporterInterface *pFVar4;
  long *local_48 [2];
  long local_38 [2];
  
  CVar1 = this->last_clause_;
  local_48[0] = local_38;
  if (CVar1 == kTimes) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,".Times() cannot appear more than once in an EXPECT_CALL().","");
    uVar2 = this->line_;
    pcVar3 = this->file_;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,local_48);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,
               ".Times() cannot appear after .InSequence(), .WillOnce(), .WillRepeatedly(), or .RetiresOnSaturation()."
               ,"");
    if (1 < (int)CVar1) {
      uVar2 = this->line_;
      pcVar3 = this->file_;
      pFVar4 = GetFailureReporter();
      (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,local_48);
    }
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  this->last_clause_ = kTimes;
  this->cardinality_specified_ = true;
  (this->cardinality_).impl_.
  super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (a_cardinality->impl_).
       super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->cardinality_).impl_.
              super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(a_cardinality->impl_).
              super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ExpectationBase::UntypedTimes(const Cardinality& a_cardinality) {
  if (last_clause_ == kTimes) {
    ExpectSpecProperty(false,
                       ".Times() cannot appear "
                       "more than once in an EXPECT_CALL().");
  } else {
    ExpectSpecProperty(last_clause_ < kTimes,
                       ".Times() cannot appear after "
                       ".InSequence(), .WillOnce(), .WillRepeatedly(), "
                       "or .RetiresOnSaturation().");
  }
  last_clause_ = kTimes;

  SpecifyCardinality(a_cardinality);
}